

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O0

int __thiscall
ncnn::Convolution_x86::forward_int8_x86
          (Convolution_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  bool bVar1;
  int iVar2;
  float *pfVar3;
  vector<float,_std::allocator<float>_> *in_RCX;
  undefined8 in_RDX;
  Mat *in_RSI;
  long *in_RDI;
  float scale_in_3;
  int p_3;
  vector<float,_std::allocator<float>_> dequantize_scales;
  float scale_in_2;
  Mat top_blob_g_1;
  Option opt_g_2;
  int p_2;
  float scale_out_1;
  float scale_in_1;
  int p_1;
  vector<float,_std::allocator<float>_> requantize_scales;
  float scale_out;
  float scale_in;
  Mat top_blob_g;
  Mat top_blob_tm_g;
  Option opt_g_1;
  int p;
  Mat top_blob_tm;
  size_t out_elemsize;
  int outh;
  int outw;
  Mat bottom_blob_bordered;
  Option opt_g;
  Mat bottom_blob_unbordered;
  int kernel_extent_h;
  int kernel_extent_w;
  size_t elemsize;
  int h;
  int w;
  int in_stack_00000474;
  int in_stack_00000478;
  int in_stack_0000047c;
  Mat *in_stack_00000480;
  Mat *in_stack_00000488;
  Mat *in_stack_00000490;
  int in_stack_000004a0;
  Mat *in_stack_000004a8;
  undefined4 in_stack_000004b0;
  int in_stack_000004b4;
  int in_stack_000004b8;
  int in_stack_000004bc;
  Mat *in_stack_000004c0;
  Mat *in_stack_000004c8;
  Mat *in_stack_000004d0;
  int in_stack_000004e0;
  Mat *in_stack_000004e8;
  vector<float,_std::allocator<float>_> *in_stack_000004f0;
  Option *in_stack_000004f8;
  Option *in_stack_00000508;
  float in_stack_00000514;
  Mat *in_stack_00000518;
  Mat *in_stack_00000520;
  Option *in_stack_00000608;
  int in_stack_00000610;
  int in_stack_00000614;
  undefined4 in_stack_00000618;
  int in_stack_0000061c;
  float in_stack_00000620;
  float in_stack_00000624;
  undefined4 in_stack_00000628;
  float in_stack_0000062c;
  Mat *in_stack_00000630;
  Option *in_stack_000008e0;
  Mat *in_stack_000008e8;
  Mat *in_stack_000008f0;
  Convolution *in_stack_000008f8;
  Option *in_stack_00000978;
  Mat *in_stack_00000980;
  Mat *in_stack_00000988;
  Mat *in_stack_00000990;
  Mat *in_stack_fffffffffffffbf0;
  value_type_conflict1 *in_stack_fffffffffffffbf8;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffc00;
  vector<float,_std::allocator<float>_> *pvVar4;
  int in_stack_fffffffffffffc08;
  int in_stack_fffffffffffffc0c;
  Mat *in_stack_fffffffffffffc10;
  undefined4 in_stack_fffffffffffffc38;
  undefined4 in_stack_fffffffffffffc3c;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffc40;
  Option *in_stack_fffffffffffffcb8;
  Mat *in_stack_fffffffffffffcc0;
  undefined4 in_stack_fffffffffffffcc8;
  undefined4 in_stack_fffffffffffffccc;
  undefined4 in_stack_fffffffffffffcd0;
  undefined4 in_stack_fffffffffffffcd4;
  int local_2ec;
  int local_254;
  int local_22c;
  int local_154;
  Mat local_150;
  ulong local_110;
  int local_104;
  int local_100;
  int local_fc;
  Mat local_f8;
  pointer local_a8;
  pointer pfStack_a0;
  pointer local_98;
  pointer pfStack_90;
  pointer local_88;
  Mat local_80;
  int local_40;
  int local_3c;
  size_t local_38;
  int local_30;
  int local_2c;
  vector<float,_std::allocator<float>_> *local_28;
  undefined8 local_20;
  int local_4;
  
  if ((1 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xc4)) ||
     (1 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 200))) {
    iVar2 = Convolution::forward
                      (in_stack_000008f8,in_stack_000008f0,in_stack_000008e8,in_stack_000008e0);
    return iVar2;
  }
  local_2c = in_RSI->w;
  local_30 = in_RSI->h;
  local_38 = in_RSI->elemsize;
  local_3c = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xc4) *
             (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xbc) + -1) + 1;
  local_40 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 200) *
             (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xc0) + -1) + 1;
  local_28 = in_RCX;
  local_20 = in_RDX;
  ncnn::Mat::Mat(&local_80,in_RSI);
  if (local_38 != 1) {
    local_88 = local_28[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish;
    local_a8 = (local_28->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
    local_98 = (local_28->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    pfStack_90 = local_28[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
    pfStack_a0 = (local_28->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
    quantize_float32_to_int8
              (in_stack_00000520,in_stack_00000518,in_stack_00000514,in_stack_00000508);
  }
  ncnn::Mat::Mat(&local_f8);
  Convolution::make_padding
            ((Convolution *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
             (Mat *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),
             in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
  bVar1 = ncnn::Mat::empty(in_stack_fffffffffffffbf0);
  if (bVar1) {
    local_4 = -100;
    local_fc = 1;
  }
  else {
    local_2c = local_f8.w;
    local_30 = local_f8.h;
    local_100 = (local_f8.w - local_3c) / *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xcc)
                + 1;
    local_104 = (local_f8.h - local_40) / *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0)
                + 1;
    local_110 = (ulong)(((byte)~*(byte *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x200) & 1) *
                        3 + 1);
    ncnn::Mat::create(in_stack_fffffffffffffc10,in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08,
                      (int)((ulong)in_stack_fffffffffffffc00 >> 0x20),
                      (size_t)in_stack_fffffffffffffbf8,(Allocator *)in_stack_fffffffffffffbf0);
    bVar1 = ncnn::Mat::empty(in_stack_fffffffffffffbf0);
    if (bVar1) {
      local_4 = -100;
      local_fc = 1;
    }
    else {
      if ((*(byte *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x200) & 1) == 0) {
        if ((*(byte *)(in_RDI + 0x17) & 1) == 0) {
          std::vector<float,_std::allocator<float>_>::vector
                    ((vector<float,_std::allocator<float>_> *)0x189ddc);
          for (local_2ec = 0; local_2ec < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xb8)
              ; local_2ec = local_2ec + 1) {
            pfVar3 = ncnn::Mat::operator[]
                               ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1b8),
                                (long)local_2ec);
            if ((*pfVar3 != 0.0) || (NAN(*pfVar3))) {
              in_stack_fffffffffffffc3c =
                   *(undefined4 *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1f8);
              in_stack_fffffffffffffc40 =
                   (vector<float,_std::allocator<float>_> *)
                   ncnn::Mat::operator[]
                             ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1b8),
                              (long)local_2ec);
            }
            std::vector<float,_std::allocator<float>_>::push_back
                      (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
          }
          std::vector<float,_std::allocator<float>_>::vector
                    (in_stack_fffffffffffffc40,
                     (vector<float,_std::allocator<float>_> *)
                     CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
          pvVar4 = local_28;
          conv_im2col_sgemm_int8_dequant_sse
                    (in_stack_00000490,in_stack_00000488,in_stack_00000480,in_stack_0000047c,
                     in_stack_00000478,in_stack_00000474,in_stack_000004a0,in_stack_000004a8,
                     (vector<float,_std::allocator<float>_> *)
                     CONCAT44(in_stack_000004b4,in_stack_000004b0),
                     (Option *)CONCAT44(in_stack_000004bc,in_stack_000004b8));
          std::vector<float,_std::allocator<float>_>::~vector(pvVar4);
          std::vector<float,_std::allocator<float>_>::~vector(pvVar4);
        }
        else {
          conv3x3s1_winograd23_int8_sse
                    (in_stack_00000990,in_stack_00000988,in_stack_00000980,in_stack_00000978);
          for (local_254 = 0; local_254 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xb8)
              ; local_254 = local_254 + 1) {
            ncnn::Mat::channel_range
                      ((Mat *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
                       (int)((ulong)in_stack_fffffffffffffc00 >> 0x20),
                       (int)in_stack_fffffffffffffc00);
            pfVar3 = ncnn::Mat::operator[]
                               ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1b8),
                                (long)local_254);
            if ((*pfVar3 != 0.0) || (NAN(*pfVar3))) {
              ncnn::Mat::operator[]
                        ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1b8),(long)local_254)
              ;
            }
            if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) != 0) {
              ncnn::Mat::operator_cast_to_float_
                        ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x178));
            }
            dequantize_int32_to_float32
                      (in_stack_00000630,in_stack_0000062c,
                       (float *)CONCAT44(in_stack_00000624,in_stack_00000620),in_stack_0000061c,
                       (Option *)CONCAT44(in_stack_00000614,in_stack_00000610));
            ncnn::Mat::~Mat((Mat *)0x189db4);
          }
        }
      }
      else {
        ncnn::Mat::Mat(&local_150);
        ncnn::Mat::create(in_stack_fffffffffffffc10,in_stack_fffffffffffffc0c,
                          in_stack_fffffffffffffc08,(int)((ulong)in_stack_fffffffffffffc00 >> 0x20),
                          (size_t)in_stack_fffffffffffffbf8,(Allocator *)in_stack_fffffffffffffbf0);
        bVar1 = ncnn::Mat::empty(in_stack_fffffffffffffbf0);
        if (bVar1) {
          local_4 = -100;
          local_fc = 1;
        }
        else {
          if ((*(byte *)(in_RDI + 0x17) & 1) == 0) {
            std::vector<float,_std::allocator<float>_>::vector
                      ((vector<float,_std::allocator<float>_> *)0x18984e);
            for (local_22c = 0;
                local_22c < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xb8);
                local_22c = local_22c + 1) {
              pfVar3 = ncnn::Mat::operator[]
                                 ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1b8),
                                  (long)local_22c);
              if ((*pfVar3 != 0.0) || (NAN(*pfVar3))) {
                ncnn::Mat::operator[]
                          ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1b8),
                           (long)local_22c);
              }
              std::vector<float,_std::allocator<float>_>::push_back
                        (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
              std::vector<float,_std::allocator<float>_>::push_back
                        (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
            }
            std::vector<float,_std::allocator<float>_>::vector
                      (in_stack_fffffffffffffc40,
                       (vector<float,_std::allocator<float>_> *)
                       CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
            pvVar4 = local_28;
            conv_im2col_sgemm_int8_requant_sse
                      (in_stack_000004d0,in_stack_000004c8,in_stack_000004c0,in_stack_000004bc,
                       in_stack_000004b8,in_stack_000004b4,in_stack_000004e0,in_stack_000004e8,
                       in_stack_000004f0,in_stack_000004f8);
            std::vector<float,_std::allocator<float>_>::~vector(pvVar4);
            std::vector<float,_std::allocator<float>_>::~vector(pvVar4);
          }
          else {
            conv3x3s1_winograd23_int8_sse
                      (in_stack_00000990,in_stack_00000988,in_stack_00000980,in_stack_00000978);
            for (local_154 = 0;
                local_154 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xb8);
                local_154 = local_154 + 1) {
              ncnn::Mat::channel_range
                        ((Mat *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
                         (int)((ulong)in_stack_fffffffffffffc00 >> 0x20),
                         (int)in_stack_fffffffffffffc00);
              ncnn::Mat::channel_range
                        ((Mat *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
                         (int)((ulong)in_stack_fffffffffffffc00 >> 0x20),
                         (int)in_stack_fffffffffffffc00);
              pfVar3 = ncnn::Mat::operator[]
                                 ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1b8),
                                  (long)local_154);
              if ((*pfVar3 != 0.0) || (NAN(*pfVar3))) {
                ncnn::Mat::operator[]
                          ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1b8),
                           (long)local_154);
              }
              if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) != 0) {
                ncnn::Mat::operator_cast_to_float_
                          ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x178));
              }
              requantize_int8_to_int8
                        (in_stack_00000630,(Mat *)CONCAT44(in_stack_0000062c,in_stack_00000628),
                         in_stack_00000624,in_stack_00000620,
                         (float *)CONCAT44(in_stack_0000061c,in_stack_00000618),in_stack_00000614,
                         in_stack_00000610,in_stack_00000608);
              ncnn::Mat::~Mat((Mat *)0x189807);
              ncnn::Mat::~Mat((Mat *)0x189814);
            }
          }
          local_fc = 0;
        }
        ncnn::Mat::~Mat((Mat *)0x189b13);
        if (local_fc != 0) goto LAB_0018a062;
      }
      if (in_RDI[1] != 0) {
        (**(code **)(*(long *)in_RDI[1] + 0x48))((long *)in_RDI[1],local_20,local_28);
      }
      local_4 = 0;
      local_fc = 1;
    }
  }
LAB_0018a062:
  ncnn::Mat::~Mat((Mat *)0x18a06f);
  ncnn::Mat::~Mat((Mat *)0x18a07c);
  return local_4;
}

Assistant:

int Convolution_x86::forward_int8_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (dilation_w > 1 || dilation_h > 1)
    {
        return Convolution::forward(bottom_blob, top_blob, opt);
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_unbordered = bottom_blob;
    if (elemsize != 1)
    {
        Option opt_g = opt;
        opt_g.blob_allocator = opt.workspace_allocator;

        quantize_float32_to_int8(bottom_blob, bottom_blob_unbordered, bottom_blob_int8_scale, opt_g);
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_unbordered, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    // int8
    size_t out_elemsize = use_int8_requantize ? 1u : 4u;

    top_blob.create(outw, outh, num_output, out_elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // int8
    if (use_int8_requantize)
    {
        Mat top_blob_tm;
        top_blob_tm.create(outw, outh, num_output, (size_t)4u, opt.workspace_allocator);
        if (top_blob_tm.empty())
            return -100;

        if (use_winograd3x3_int8)
        {
            conv3x3s1_winograd23_int8_sse(bottom_blob_bordered, top_blob_tm, weight_3x3_winograd23_data_int8, opt);
//             conv3x3s1_winograd43_int8_sse(bottom_blob_bordered, top_blob_tm, weight_3x3_winograd23_data_int8, opt);

            // requantize, reverse scale inplace
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p=0; p<num_output; p++)
            {
                Option opt_g = opt;
                opt_g.num_threads = 1;
                opt_g.blob_allocator = top_blob.allocator;

                Mat top_blob_tm_g = top_blob_tm.channel_range(p, 1);
                Mat top_blob_g = top_blob.channel_range(p, 1);

                // requantize and relu
                float scale_in;
                if (weight_data_int8_scales[p] == 0)
                    scale_in = 0;
                else
                    scale_in = 1.f / (bottom_blob_int8_scale * weight_data_int8_scales[p]);

                float scale_out = top_blob_int8_scale;//FIXME load param

                requantize_int8_to_int8(top_blob_tm_g, top_blob_g, scale_in, scale_out, bias_term ? (const float*)bias_data + p : 0, bias_term ? 1 : 0, 0, opt_g);
            }
        }
        else
        {
            std::vector<float> requantize_scales;
            for (int p=0; p<num_output; p++)
            {
                float scale_in;
                if (weight_data_int8_scales[p] == 0)
                    scale_in = 0;
                else
                    scale_in = 1.f / (bottom_blob_int8_scale * weight_data_int8_scales[p]);

                float scale_out = top_blob_int8_scale;

                requantize_scales.push_back(scale_in);
                requantize_scales.push_back(scale_out);
            }

            conv_im2col_sgemm_int8_requant_sse(bottom_blob_bordered, top_blob, weight_data, kernel_w, kernel_h, stride_w, stride_h, bias_data, requantize_scales, opt);
        }
    }
    else
    {
        if (use_winograd3x3_int8)
        {
            conv3x3s1_winograd23_int8_sse(bottom_blob_bordered, top_blob, weight_3x3_winograd23_data_int8, opt);
//             conv3x3s1_winograd43_int8_sse(bottom_blob_bordered, top_blob, weight_3x3_winograd23_data_int8, opt);

            // dequantize, reverse scale inplace
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p=0; p<num_output; p++)
            {
                Option opt_g = opt;
                opt_g.num_threads = 1;
                opt_g.blob_allocator = top_blob.allocator;

                Mat top_blob_g = top_blob.channel_range(p, 1);

                // dequantize
                float scale_in;
                if (weight_data_int8_scales[p] == 0)
                    scale_in = 0;
                else
                    scale_in = 1.f / (bottom_blob_int8_scale * weight_data_int8_scales[p]);

                dequantize_int32_to_float32(top_blob_g, scale_in, bias_term ? (const float*)bias_data + p : 0, bias_term ? 1 : 0, opt_g);
            }
        }
        else
        {
            std::vector<float> dequantize_scales;
            for (int p=0; p<num_output; p++)
            {
                float scale_in;
                if (weight_data_int8_scales[p] == 0)
                    scale_in = 0;
                else
                    scale_in = 1.f / (bottom_blob_int8_scale * weight_data_int8_scales[p]);

                dequantize_scales.push_back(scale_in);
            }

            conv_im2col_sgemm_int8_dequant_sse(bottom_blob_bordered, top_blob, weight_data, kernel_w, kernel_h, stride_w, stride_h, bias_data, dequantize_scales, opt);
        }
    }

    if (activation)
    {
        activation->forward_inplace(top_blob, opt);
    }

    return 0;
}